

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O3

void recordingFrameAdded(void)

{
  bool *pbVar1;
  
  counter = counter + 1;
  if (sec) {
    sec_head = fdelta + sec_head;
    if (sec_head < sec_end) {
      return;
    }
    pbVar1 = &sec;
  }
  else {
    if (!frame) {
      return;
    }
    frame_head = frame_head + 1;
    if (frame_head < frame_end) {
      return;
    }
    pbVar1 = &frame;
  }
  *pbVar1 = false;
  return;
}

Assistant:

void recordingFrameAdded() {
    counter++;

    if (sec) {
        sec_head += fdelta;
        if (sec_head >= sec_end)
            sec = false;
    }
    #if defined(SUPPORT_LIBAV) && !defined(PLATFORM_RPI)
    else if (recordingPipe()) {
        sec_head += fdelta;
        if (sec_head >= sec_end)
            pipe_isRecording = false;
    }
    #endif
    else if (frame) {
        frame_head++;
        if (frame_head >= frame_end)
            frame = false;
    }
}